

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O0

void __thiscall
vkt::compute::anon_unknown_0::WriteToMultipleSSBOTest::initPrograms
          (WriteToMultipleSSBOTest *this,SourceCollections *sourceCollections)

{
  int iVar1;
  ostream *poVar2;
  ProgramSources *this_00;
  string local_260;
  ShaderSource local_240;
  allocator<char> local_211;
  string local_210;
  byte local_1ea;
  allocator<char> local_1e9;
  string local_1e8;
  byte local_1c2;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream src;
  SourceCollections *sourceCollections_local;
  WriteToMultipleSSBOTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,"#version 310 es\n");
  poVar2 = std::operator<<(poVar2,"layout (local_size_x = ");
  iVar1 = tcu::Vector<int,_3>::x(&this->m_localSize);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,", local_size_y = ");
  iVar1 = tcu::Vector<int,_3>::y(&this->m_localSize);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,", local_size_z = ");
  iVar1 = tcu::Vector<int,_3>::z(&this->m_localSize);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,") in;\n");
  poVar2 = std::operator<<(poVar2,"layout(binding = 0) writeonly buffer Out0 {\n");
  poVar2 = std::operator<<(poVar2,"    uint values[");
  local_1c2 = 0;
  if ((this->m_sized & 1U) == 0) {
    std::allocator<char>::allocator();
    local_1c2 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"",&local_1c1);
  }
  else {
    de::toString<unsigned_int>(&local_1c0,&this->m_numValues);
  }
  poVar2 = std::operator<<(poVar2,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"];\n");
  poVar2 = std::operator<<(poVar2,"} sb_out0;\n");
  poVar2 = std::operator<<(poVar2,"layout(binding = 1) writeonly buffer Out1 {\n");
  poVar2 = std::operator<<(poVar2,"    uint values[");
  local_1ea = 0;
  if ((this->m_sized & 1U) == 0) {
    std::allocator<char>::allocator();
    local_1ea = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"",&local_1e9);
  }
  else {
    de::toString<unsigned_int>(&local_1e8,&this->m_numValues);
  }
  poVar2 = std::operator<<(poVar2,(string *)&local_1e8);
  poVar2 = std::operator<<(poVar2,"];\n");
  poVar2 = std::operator<<(poVar2,"} sb_out1;\n");
  poVar2 = std::operator<<(poVar2,"void main (void) {\n");
  poVar2 = std::operator<<(poVar2,"    uvec3 size      = gl_NumWorkGroups * gl_WorkGroupSize;\n");
  poVar2 = std::operator<<(poVar2,
                           "    uint groupNdx   = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
                          );
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"    {\n");
  poVar2 = std::operator<<(poVar2,
                           "        uint numValuesPerInv = uint(sb_out0.values.length()) / (size.x*size.y*size.z);\n"
                          );
  poVar2 = std::operator<<(poVar2,"        uint offset          = numValuesPerInv*groupNdx;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n");
  poVar2 = std::operator<<(poVar2,"            sb_out0.values[offset + ndx] = offset + ndx;\n");
  poVar2 = std::operator<<(poVar2,"    }\n");
  poVar2 = std::operator<<(poVar2,"    {\n");
  poVar2 = std::operator<<(poVar2,
                           "        uint numValuesPerInv = uint(sb_out1.values.length()) / (size.x*size.y*size.z);\n"
                          );
  poVar2 = std::operator<<(poVar2,"        uint offset          = numValuesPerInv*groupNdx;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n");
  poVar2 = std::operator<<(poVar2,
                           "            sb_out1.values[offset + ndx] = uint(sb_out1.values.length()) - offset - ndx;\n"
                          );
  poVar2 = std::operator<<(poVar2,"    }\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::~string((string *)&local_1e8);
  if ((local_1ea & 1) != 0) {
    std::allocator<char>::~allocator(&local_1e9);
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  if ((local_1c2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_1c1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"comp",&local_211);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_210);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_240,&local_260);
  glu::ProgramSources::operator<<(this_00,&local_240);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void WriteToMultipleSSBOTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream src;
	src << "#version 310 es\n"
		<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ", local_size_z = " << m_localSize.z() << ") in;\n"
		<< "layout(binding = 0) writeonly buffer Out0 {\n"
		<< "    uint values[" << (m_sized ? de::toString(m_numValues) : "") << "];\n"
		<< "} sb_out0;\n"
		<< "layout(binding = 1) writeonly buffer Out1 {\n"
		<< "    uint values[" << (m_sized ? de::toString(m_numValues) : "") << "];\n"
		<< "} sb_out1;\n"
		<< "void main (void) {\n"
		<< "    uvec3 size      = gl_NumWorkGroups * gl_WorkGroupSize;\n"
		<< "    uint groupNdx   = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
		<< "\n"
		<< "    {\n"
		<< "        uint numValuesPerInv = uint(sb_out0.values.length()) / (size.x*size.y*size.z);\n"
		<< "        uint offset          = numValuesPerInv*groupNdx;\n"
		<< "\n"
		<< "        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
		<< "            sb_out0.values[offset + ndx] = offset + ndx;\n"
		<< "    }\n"
		<< "    {\n"
		<< "        uint numValuesPerInv = uint(sb_out1.values.length()) / (size.x*size.y*size.z);\n"
		<< "        uint offset          = numValuesPerInv*groupNdx;\n"
		<< "\n"
		<< "        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
		<< "            sb_out1.values[offset + ndx] = uint(sb_out1.values.length()) - offset - ndx;\n"
		<< "    }\n"
		<< "}\n";

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}